

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O0

void __thiscall
Camera::Camera(Camera *this,Vector3f *center,Vector3f *direction,Vector3f *up,int imgW,int imgH)

{
  Vector3f *in_RDI;
  float in_R8D;
  float in_R9D;
  Vector3f *in_stack_ffffffffffffff98;
  Vector3f *in_stack_ffffffffffffffb8;
  Vector3f *in_stack_ffffffffffffffd0;
  
  *(undefined ***)in_RDI->m_elements = &PTR__Camera_003d2818;
  Vector3f::Vector3f((Vector3f *)(in_RDI->m_elements + 2),0.0);
  Vector3f::Vector3f((Vector3f *)(in_RDI[1].m_elements + 2),0.0);
  Vector3f::Vector3f((Vector3f *)(in_RDI[2].m_elements + 2),0.0);
  Vector3f::Vector3f((Vector3f *)(in_RDI[3].m_elements + 2),0.0);
  Vector3f::operator=(in_RDI,in_stack_ffffffffffffff98);
  Vector3f::normalized(in_stack_ffffffffffffffb8);
  Vector3f::operator=(in_RDI,in_stack_ffffffffffffff98);
  Vector3f::cross((Vector3f *)CONCAT44(in_R8D,in_R9D),in_stack_ffffffffffffffd0);
  Vector3f::normalized(in_stack_ffffffffffffffb8);
  Vector3f::operator=(in_RDI,in_stack_ffffffffffffff98);
  Vector3f::cross((Vector3f *)CONCAT44(in_R8D,in_R9D),in_stack_ffffffffffffffd0);
  Vector3f::operator=(in_RDI,in_stack_ffffffffffffff98);
  in_RDI[4].m_elements[2] = in_R8D;
  in_RDI[5].m_elements[0] = in_R9D;
  return;
}

Assistant:

Camera(const Vector3f& center, const Vector3f& direction, const Vector3f& up, int imgW, int imgH) {
		this->center = center;
		this->direction = direction.normalized();
		this->horizontal = Vector3f::cross(this->direction, up).normalized();
		this->up = Vector3f::cross(this->horizontal, this->direction);
		this->width = imgW;
		this->height = imgH;
	}